

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O0

aphy_error __thiscall
aphy::ref_counter<aphy::motion_state>::retain(ref_counter<aphy::motion_state> *this)

{
  __int_type _Var1;
  __atomic_base<unsigned_int> *p_Var2;
  __atomic_base<unsigned_int> *in_RDI;
  __int_type old;
  aphy_error local_1c;
  
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int(in_RDI);
  if (_Var1 == 0) {
    local_1c = APHY_INVALID_OPERATION;
  }
  else {
    p_Var2 = in_RDI + 4;
    LOCK();
    _Var1 = p_Var2->_M_i;
    p_Var2->_M_i = p_Var2->_M_i + 1;
    UNLOCK();
    if (_Var1 == 0) {
      local_1c = APHY_INVALID_OPERATION;
    }
    else {
      local_1c = APHY_OK;
    }
  }
  return local_1c;
}

Assistant:

aphy_error retain()
    {
        // Check once before doing the increase.
        if(strongCount == 0)
            return APHY_INVALID_OPERATION;

        // Increase the referenece count.
        auto old = strongCount.fetch_add(1, std::memory_order_relaxed);

        // Check again, for concurrency reasons.
        if(old == 0)
            return APHY_INVALID_OPERATION;

        return APHY_OK;
    }